

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O0

TiledInputFile * __thiscall
Imf_3_3::MultiPartInputFile::getInputPart<Imf_3_3::TiledInputFile>
          (MultiPartInputFile *this,int partNumber)

{
  bool bVar1;
  TiledInputFile *this_00;
  element_type *peVar2;
  TiledInputFile *pTVar3;
  ostream *poVar4;
  size_type sVar5;
  undefined8 uVar6;
  reference pvVar7;
  element_type *peVar8;
  int in_ESI;
  file_storage f;
  lock_guard<std::mutex> lock;
  stringstream _iex_throw_s;
  stringstream *in_stack_fffffffffffffde8;
  ArgExc *in_stack_fffffffffffffdf0;
  TiledInputFile *in_stack_fffffffffffffdf8;
  any *in_stack_fffffffffffffe00;
  InputPartData *in_stack_fffffffffffffe18;
  __shared_ptr<Imf_3_3::TiledInputFile,_(__gnu_cxx::_Lock_policy)2> local_1c0 [2];
  stringstream local_198 [16];
  ostream local_188 [380];
  int local_c;
  
  local_c = in_ESI;
  if (-1 < in_ESI) {
    this_00 = (TiledInputFile *)(long)in_ESI;
    peVar2 = std::
             __shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x137608);
    pTVar3 = (TiledInputFile *)
             std::
             vector<Imf_3_3::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_3::MultiPartInputFile::Data::Part>_>
             ::size(&peVar2->parts);
    if (this_00 < pTVar3) {
      std::
      __shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x13774e);
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)in_stack_fffffffffffffdf0,
                 (mutex_type *)in_stack_fffffffffffffde8);
      std::shared_ptr<Imf_3_3::TiledInputFile>::shared_ptr
                ((shared_ptr<Imf_3_3::TiledInputFile> *)0x137765);
      peVar2 = std::
               __shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x137773);
      pvVar7 = std::
               vector<Imf_3_3::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_3::MultiPartInputFile::Data::Part>_>
               ::operator[](&peVar2->parts,(long)local_c);
      bVar1 = std::any::has_value(&pvVar7->file);
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x137868);
        std::
        vector<Imf_3_3::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_3::MultiPartInputFile::Data::Part>_>
        ::operator[](&peVar2->parts,(long)local_c);
        std::any_cast<std::shared_ptr<Imf_3_3::TiledInputFile>>((any *)in_stack_fffffffffffffdf8);
        std::shared_ptr<Imf_3_3::TiledInputFile>::operator=
                  ((shared_ptr<Imf_3_3::TiledInputFile> *)in_stack_fffffffffffffdf0,
                   (shared_ptr<Imf_3_3::TiledInputFile> *)in_stack_fffffffffffffde8);
        std::shared_ptr<Imf_3_3::TiledInputFile>::~shared_ptr
                  ((shared_ptr<Imf_3_3::TiledInputFile> *)0x1378a8);
      }
      else {
        operator_new(0x20);
        peVar2 = std::
                 __shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1377ba);
        std::
        vector<Imf_3_3::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_3::MultiPartInputFile::Data::Part>_>
        ::operator[](&peVar2->parts,(long)local_c);
        TiledInputFile::TiledInputFile(this_00,in_stack_fffffffffffffe18);
        std::__shared_ptr<Imf_3_3::TiledInputFile,_(__gnu_cxx::_Lock_policy)2>::
        reset<Imf_3_3::TiledInputFile>
                  ((__shared_ptr<Imf_3_3::TiledInputFile,_(__gnu_cxx::_Lock_policy)2> *)
                   in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        peVar2 = std::
                 __shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1377fc);
        std::
        vector<Imf_3_3::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_3::MultiPartInputFile::Data::Part>_>
        ::operator[](&peVar2->parts,(long)local_c);
        std::any::operator=(in_stack_fffffffffffffe00,
                            (shared_ptr<Imf_3_3::TiledInputFile> *)in_stack_fffffffffffffdf8);
      }
      peVar8 = std::__shared_ptr<Imf_3_3::TiledInputFile,_(__gnu_cxx::_Lock_policy)2>::get
                         (local_1c0);
      std::shared_ptr<Imf_3_3::TiledInputFile>::~shared_ptr
                ((shared_ptr<Imf_3_3::TiledInputFile> *)0x1378c0);
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1378ca);
      return peVar8;
    }
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_198);
  poVar4 = std::operator<<(local_188,"MultiPartInputFile::getPart called with invalid part ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_c);
  poVar4 = std::operator<<(poVar4," on file with ");
  peVar2 = std::
           __shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x137692);
  sVar5 = std::
          vector<Imf_3_3::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_3::MultiPartInputFile::Data::Part>_>
          ::size(&peVar2->parts);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  std::operator<<(poVar4," parts");
  uVar6 = __cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  __cxa_throw(uVar6,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

T*
MultiPartInputFile::getInputPart (int partNumber)
{
    if (partNumber < 0 || static_cast<size_t> (partNumber) >= _data->parts.size ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "MultiPartInputFile::getPart called with invalid part "
                << partNumber << " on file with " << _data->parts.size () << " parts");
    }

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    using file_storage = std::shared_ptr<T>;
    file_storage f;
    if (!_data->parts[partNumber].file.has_value ())
    {
        // TODO: change to copy / value semantics
        // stupid make_shared and friend functions, can we remove this restriction?
        // f = std::make_shared<T> (&(_data->parts[partNumber].data));
        f.reset (new T (&(_data->parts[partNumber].data)));
        _data->parts[partNumber].file = f;
    }
    else
        f = std::any_cast<file_storage> (_data->parts[partNumber].file);

    // TODO: change to by reference / value semantics
    return f.get();
}